

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O3

void __thiscall DataSet::normalize(DataSet *this,double beg,double end)

{
  double dVar1;
  uint uVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  double *pdVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  double local_30;
  
  if ((this->m_inputSet).m_shape.field_0.m_dims[1] != 0) {
    uVar2 = (this->m_inputSet).m_shape.field_0.m_dims[0];
    uVar6 = 0;
    do {
      bVar7 = uVar2 != 0;
      uVar2 = 0;
      if (bVar7) {
        dVar8 = 0.0;
        local_30 = 0.0;
        uVar5 = 0;
        do {
          pvVar3 = Matrix::operator[](&this->m_inputSet,uVar5);
          if (local_30 <
              (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar6]) {
            pvVar3 = Matrix::operator[](&this->m_inputSet,uVar5);
            local_30 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar6];
          }
          pvVar3 = Matrix::operator[](&this->m_inputSet,uVar5);
          pdVar4 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar6;
          if (*pdVar4 <= dVar8 && dVar8 != *pdVar4) {
            pvVar3 = Matrix::operator[](&this->m_inputSet,uVar5);
            dVar8 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar6];
          }
          uVar5 = uVar5 + 1;
          uVar2 = (this->m_inputSet).m_shape.field_0.m_dims[0];
        } while (uVar5 < uVar2);
        if (uVar2 == 0) {
          uVar2 = 0;
        }
        else {
          uVar5 = 0;
          do {
            pvVar3 = Matrix::operator[](&this->m_inputSet,uVar5);
            dVar1 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar6];
            pdVar4 = Matrix::set(&this->m_inputSet,uVar5,(uint)uVar6);
            *pdVar4 = (dVar1 - dVar8) / (local_30 - dVar8);
            uVar5 = uVar5 + 1;
            uVar2 = (this->m_inputSet).m_shape.field_0.m_dims[0];
          } while (uVar5 < uVar2);
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->m_inputSet).m_shape.field_0.m_dims[1]);
  }
  return;
}

Assistant:

void DataSet::normalize(double beg, double end){
    for(uint i=0;i<m_inputSet.m_shape.n_col;++i){
        double min=0, max=0;
        for(uint j=0;j<m_inputSet.m_shape.n_row;++j){
            if(max<m_inputSet[j][i]) max=m_inputSet[j][i];
            if(min>m_inputSet[j][i]) min=m_inputSet[j][i];
        }
        for(uint j=0;j<m_inputSet.m_shape.n_row;++j){
            m_inputSet.set(j, i)=(m_inputSet[j][i]-min)/(max-min);
        }
    }
}